

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

char * lj_strfmt_wptr(char *p,void *v)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (v != (void *)0x0) {
    uVar2 = 10;
    if ((ulong)v >> 0x20 != 0) {
      uVar2 = 0x1f;
      uVar3 = (uint)((ulong)v >> 0x20);
      if (uVar3 != 0) {
        for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      uVar2 = (uVar2 >> 2 & 6) + 0xc;
    }
    p[0] = '0';
    p[1] = 'x';
    uVar1 = (ulong)(uVar2 - 1);
    do {
      uVar4 = uVar1 - 1;
      p[uVar1] = "0123456789abcdef"[(uint)v & 0xf];
      v = (void *)((long)v >> 4);
      uVar1 = uVar4;
    } while ((uVar4 & 0xfffffffe) != 0);
    return p + uVar2;
  }
  builtin_strncpy(p,"NULL",4);
  return p + 4;
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wptr(char *p, const void *v)
{
  ptrdiff_t x = (ptrdiff_t)v;
  MSize i, n = STRFMT_MAXBUF_PTR;
  if (x == 0) {
    *p++ = 'N'; *p++ = 'U'; *p++ = 'L'; *p++ = 'L';
    return p;
  }
#if LJ_64
  /* Shorten output for 64 bit pointers. */
  n = 2+2*4+((x >> 32) ? 2+2*(lj_fls((uint32_t)(x >> 32))>>3) : 0);
#endif
  p[0] = '0';
  p[1] = 'x';
  for (i = n-1; i >= 2; i--, x >>= 4)
    p[i] = "0123456789abcdef"[(x & 15)];
  return p+n;
}